

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

bool __thiscall
caffe::ReLUParameter::MergePartialFromCodedStream(ReLUParameter *this,CodedInputStream *input)

{
  InternalMetadataWithArena *this_00;
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  void *pvVar4;
  ulong uVar5;
  bool bVar6;
  uint32 uVar7;
  uint uVar8;
  undefined8 in_RAX;
  int iVar9;
  UnknownFieldSet *pUVar10;
  uint uVar11;
  ulong unaff_RBP;
  ulong uVar12;
  undefined8 uStack_38;
  
  this_00 = &this->_internal_metadata_;
  uStack_38 = in_RAX;
  do {
    pbVar2 = input->buffer_;
    uVar7 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar7 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003b1a59;
      input->buffer_ = pbVar2 + 1;
      uVar12 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003b1a59:
      uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar12 = 0;
      if (uVar7 - 1 < 0x7f) {
        uVar12 = 0x100000000;
      }
      uVar12 = uVar7 | uVar12;
    }
    uVar11 = (uint)uVar12;
    if ((uVar12 & 0x100000000) == 0) {
LAB_003b1aea:
      if ((uVar11 & 7) == 4 || uVar11 == 0) {
        iVar9 = 7;
      }
      else {
        pvVar4 = (this_00->
                 super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 ).ptr_;
        if (((ulong)pvVar4 & 1) == 0) {
          pUVar10 = google::protobuf::internal::
                    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                    ::mutable_unknown_fields_slow
                              (&this_00->
                                super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                              );
        }
        else {
          pUVar10 = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
        }
        bVar6 = google::protobuf::internal::WireFormat::SkipField(input,uVar11,pUVar10);
        iVar9 = 6;
        if (bVar6) goto LAB_003b1b23;
      }
    }
    else {
      uVar8 = (uint)(uVar12 >> 3) & 0x1fffffff;
      if (uVar8 == 2) {
        if ((char)uVar12 != '\x10') goto LAB_003b1aea;
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar12 = (ulong)bVar1;
          uVar7 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_003b1b5a;
          input->buffer_ = pbVar2 + 1;
          bVar6 = true;
        }
        else {
          uVar7 = 0;
LAB_003b1b5a:
          uVar12 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
          bVar6 = -1 < (long)uVar12;
        }
        iVar9 = 6;
        uVar5 = unaff_RBP;
        if (bVar6) {
          uVar5 = uVar12;
        }
        unaff_RBP = uVar5 & 0xffffffff;
        if (bVar6) {
          uVar11 = (uint)uVar5;
          if (uVar11 < 3) {
            *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
            this->engine_ = uVar11;
          }
          else {
            pvVar4 = (this_00->
                     super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                     ).ptr_;
            if (((ulong)pvVar4 & 1) == 0) {
              pUVar10 = google::protobuf::internal::
                        InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        ::mutable_unknown_fields_slow
                                  (&this_00->
                                    super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                                  );
            }
            else {
              pUVar10 = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
            }
            google::protobuf::UnknownFieldSet::AddVarint(pUVar10,2,(long)(int)uVar11);
          }
          iVar9 = 0;
        }
        if (!bVar6) goto LAB_003b1b25;
      }
      else {
        if ((uVar8 != 1) || ((char)uVar12 != '\r')) goto LAB_003b1aea;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        puVar3 = input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)puVar3 < 4) {
          bVar6 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                            (input,(uint32 *)((long)&uStack_38 + 4));
          if (!bVar6) {
            iVar9 = 6;
            goto LAB_003b1b25;
          }
        }
        else {
          uStack_38 = CONCAT44(*(undefined4 *)puVar3,(undefined4)uStack_38);
          input->buffer_ = puVar3 + 4;
        }
        this->negative_slope_ = uStack_38._4_4_;
      }
LAB_003b1b23:
      iVar9 = 0;
    }
LAB_003b1b25:
    if (iVar9 != 0) {
      return iVar9 != 6;
    }
  } while( true );
}

Assistant:

bool ReLUParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.ReLUParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional float negative_slope = 1 [default = 0];
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(13u)) {
          set_has_negative_slope();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &negative_slope_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ReLUParameter.Engine engine = 2 [default = DEFAULT];
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::caffe::ReLUParameter_Engine_IsValid(value)) {
            set_engine(static_cast< ::caffe::ReLUParameter_Engine >(value));
          } else {
            mutable_unknown_fields()->AddVarint(2, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.ReLUParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.ReLUParameter)
  return false;
#undef DO_
}